

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O0

size_t fct_ts__tst_cnt(fct_ts_t *ts)

{
  size_t sVar1;
  fct_ts_t *ts_local;
  
  if (ts == (fct_ts_t *)0x0) {
    __assert_fail("ts != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x51b
                  ,"size_t fct_ts__tst_cnt(const fct_ts_t *)");
  }
  if (ts->mode != ts_mode_end) {
    __assert_fail("((ts)->mode == ts_mode_end) && \"can\'t count number of tests executed until the test suite ends\""
                  ,"/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",
                  0x51f,"size_t fct_ts__tst_cnt(const fct_ts_t *)");
  }
  sVar1 = fct_nlist__size(&ts->test_list);
  return sVar1;
}

Assistant:

static size_t
fct_ts__tst_cnt(fct_ts_t const *ts)
{
    FCT_ASSERT( ts != NULL );
    FCT_ASSERT(
        fct_ts__is_end(ts)
        && "can't count number of tests executed until the test suite ends"
    );
    return fct_nlist__size(&(ts->test_list));
}